

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_shuffle_addr(Curl_easy *data,Curl_addrinfo **addr)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  CURLcode CVar4;
  undefined8 *puVar5;
  uchar *rnd_00;
  Curl_addrinfo *swap_tmp;
  size_t rnd_size;
  uint *rnd;
  int i;
  Curl_addrinfo **nodes;
  int num_addrs;
  CURLcode result;
  Curl_addrinfo **addr_local;
  Curl_easy *data_local;
  
  nodes._4_4_ = CURLE_OK;
  uVar3 = num_addresses(*addr);
  if (1 < (int)uVar3) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Shuffling %i addresses",(ulong)uVar3);
    }
    puVar5 = (undefined8 *)(*Curl_cmalloc)((long)(int)uVar3 << 3);
    if (puVar5 == (undefined8 *)0x0) {
      nodes._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *puVar5 = *addr;
      for (rnd._4_4_ = 1; (int)rnd._4_4_ < (int)uVar3; rnd._4_4_ = rnd._4_4_ + 1) {
        puVar5[(int)rnd._4_4_] = *(undefined8 *)(puVar5[(int)(rnd._4_4_ + -1)] + 0x28);
      }
      rnd_00 = (uchar *)(*Curl_cmalloc)((long)(int)uVar3 << 2);
      if (rnd_00 == (uchar *)0x0) {
        nodes._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar4 = Curl_rand_bytes(data,rnd_00,(long)(int)uVar3 << 2);
        uVar2 = uVar3;
        if (CVar4 == CURLE_OK) {
          while (rnd._4_4_ = uVar2 - 1, 0 < (int)rnd._4_4_) {
            uVar1 = puVar5[(ulong)*(uint *)(rnd_00 + (long)(int)rnd._4_4_ * 4) % (ulong)uVar2];
            puVar5[(ulong)*(uint *)(rnd_00 + (long)(int)rnd._4_4_ * 4) % (ulong)uVar2] =
                 puVar5[(int)rnd._4_4_];
            puVar5[(int)rnd._4_4_] = uVar1;
            uVar2 = rnd._4_4_;
          }
          for (rnd._4_4_ = 1; (int)rnd._4_4_ < (int)uVar3; rnd._4_4_ = rnd._4_4_ + 1) {
            *(undefined8 *)(puVar5[(int)(rnd._4_4_ + -1)] + 0x28) = puVar5[(int)rnd._4_4_];
          }
          *(undefined8 *)(puVar5[(int)(uVar3 - 1)] + 0x28) = 0;
          *addr = (Curl_addrinfo *)*puVar5;
        }
        (*Curl_cfree)(rnd_00);
      }
      (*Curl_cfree)(puVar5);
    }
  }
  return nodes._4_4_;
}

Assistant:

UNITTEST CURLcode Curl_shuffle_addr(struct Curl_easy *data,
                                    struct Curl_addrinfo **addr)
{
  CURLcode result = CURLE_OK;
  const int num_addrs = num_addresses(*addr);

  if(num_addrs > 1) {
    struct Curl_addrinfo **nodes;
    infof(data, "Shuffling %i addresses", num_addrs);

    nodes = malloc(num_addrs*sizeof(*nodes));
    if(nodes) {
      int i;
      unsigned int *rnd;
      const size_t rnd_size = num_addrs * sizeof(*rnd);

      /* build a plain array of Curl_addrinfo pointers */
      nodes[0] = *addr;
      for(i = 1; i < num_addrs; i++) {
        nodes[i] = nodes[i-1]->ai_next;
      }

      rnd = malloc(rnd_size);
      if(rnd) {
        /* Fisher-Yates shuffle */
        if(Curl_rand(data, (unsigned char *)rnd, rnd_size) == CURLE_OK) {
          struct Curl_addrinfo *swap_tmp;
          for(i = num_addrs - 1; i > 0; i--) {
            swap_tmp = nodes[rnd[i] % (unsigned int)(i + 1)];
            nodes[rnd[i] % (unsigned int)(i + 1)] = nodes[i];
            nodes[i] = swap_tmp;
          }

          /* relink list in the new order */
          for(i = 1; i < num_addrs; i++) {
            nodes[i-1]->ai_next = nodes[i];
          }

          nodes[num_addrs-1]->ai_next = NULL;
          *addr = nodes[0];
        }
        free(rnd);
      }
      else
        result = CURLE_OUT_OF_MEMORY;
      free(nodes);
    }
    else
      result = CURLE_OUT_OF_MEMORY;
  }
  return result;
}